

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O0

bool __thiscall KDReports::Report::exportToFile(Report *this,QString *fileName,QWidget *parent)

{
  byte bVar1;
  pointer pRVar2;
  QString local_68;
  byte local_4d;
  bool ret;
  QPrinter local_40 [8];
  QPrinter printer;
  QWidget *parent_local;
  QString *fileName_local;
  Report *this_local;
  
  pRVar2 = std::unique_ptr<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_>
           ::operator->(&this->d);
  ReportPrivate::ensureLayouted(pRVar2);
  QPrinter::QPrinter(local_40,0);
  QPrinter::setOutputFileName((QString *)local_40);
  setupPrinter(this,local_40);
  pRVar2 = std::unique_ptr<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_>
           ::operator->(&this->d);
  local_4d = ReportPrivate::doPrint(pRVar2,local_40,parent);
  QString::QString(&local_68);
  QPrinter::setOutputFileName((QString *)local_40);
  QString::~QString(&local_68);
  bVar1 = local_4d;
  QPrinter::~QPrinter(local_40);
  return (bool)(bVar1 & 1);
}

Assistant:

bool KDReports::Report::exportToFile(const QString &fileName, QWidget *parent)
{
    d->ensureLayouted();
    QPrinter printer;
    printer.setOutputFileName(fileName); // must be done before setupPrinter, since it affects DPI
    setupPrinter(&printer);
    const bool ret = d->doPrint(&printer, parent);
    printer.setOutputFileName(QString());
    return ret;
}